

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::StartEmitCatch(ByteCodeGenerator *this,ParseNodeCatch *pnodeCatch)

{
  uint uVar1;
  uint uVar2;
  FuncInfo *this_00;
  ParseNode *this_01;
  ParseNodePtr patternNode;
  Symbol *this_02;
  code *pcVar3;
  anon_class_24_3_b926b611 handler;
  Scope *funcInfo_00;
  bool bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  ParseNodeParamPattern *pPVar7;
  ParseNodeName *pPVar8;
  ushort uVar9;
  Scope *this_03;
  Scope *local_40;
  Scope *scope;
  FuncInfo *funcInfo;
  
  if ((pnodeCatch->super_ParseNodeStmt).super_ParseNode.nop != knopCatch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xfa2,"(pnodeCatch->nop == knopCatch)","pnodeCatch->nop == knopCatch");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_03 = pnodeCatch->scope;
  this_00 = this_03->func;
  local_40 = this_03;
  scope = (Scope *)this_00;
  if (((this_00->field_0xb4 & 6) != 0) || ((this->flags & 0x404) != 0)) {
    Scope::SetIsObject(this_03);
  }
  this_01 = pnodeCatch->pnodeParam;
  if (this_01 == (ParseNode *)0x0) goto LAB_00808f87;
  if (this_01->nop == knopParamPattern) {
    pPVar7 = ParseNode::AsParseNodeParamPattern(this_01);
    uVar1 = *(uint *)&this_00->field_0xb4;
    uVar5 = 8;
    if ((uVar1 & 2) == 0) {
      uVar5 = (short)uVar1 * 2 & 8;
    }
    patternNode = (pPVar7->super_ParseNodeUni).pnode1;
    uVar2 = *(uint *)&this_03->field_0x44;
    uVar5 = (ushort)uVar2 & 0xfff7 | uVar5;
    *(ushort *)&this_03->field_0x44 = uVar5;
    if (this_03->m_count < 1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0x10;
      if (((uVar1 & 6) == 0) && ((uVar2 & 0x10) == 0)) {
        bVar4 = FuncInfo::IsGlobalFunction(this_00);
        uVar9 = (ushort)bVar4 << 4;
        uVar5 = *(ushort *)&this_03->field_0x44;
      }
    }
    *(ushort *)&this_03->field_0x44 = uVar9 | uVar5 & 0xffef;
    handler.scope = &local_40;
    handler.funcInfo = (FuncInfo **)&scope;
    handler.this = this;
    Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>
              (patternNode,handler);
    this_03 = local_40;
    goto LAB_00808f87;
  }
  pPVar8 = ParseNode::AsParseNodeName(this_01);
  this_02 = pPVar8->sym;
  if ((this_00->field_0xb4 & 6) == 0) {
    uVar5 = *(ushort *)&this_03->field_0x44;
    if ((this_02->field_0x42 & 0x10) != 0) goto LAB_00808f12;
    *(ushort *)&this_03->field_0x44 = uVar5 & 0xfff7;
    bVar4 = FuncInfo::IsGlobalFunction(this_00);
    uVar5 = *(ushort *)&this_03->field_0x44;
    uVar9 = (ushort)bVar4 << 4;
  }
  else {
    uVar5 = *(ushort *)&this_03->field_0x44;
LAB_00808f12:
    uVar5 = uVar5 | 8;
    *(ushort *)&this_03->field_0x44 = uVar5;
    uVar9 = 0x10;
  }
  funcInfo_00 = scope;
  *(ushort *)&this_03->field_0x44 = uVar9 | uVar5 & 0xffef;
  bVar4 = FuncInfo::IsGlobalFunction((FuncInfo *)scope);
  this_03 = local_40;
  if (bVar4) {
    this_02->field_0x43 = this_02->field_0x43 | 2;
  }
  if ((this_02->field_0x44 & 0x40) != 0) {
    Scope::SetIsObject(local_40);
  }
  if ((this_03->field_0x44 & 0x10) != 0) {
    bVar4 = Symbol::IsInSlot(this_02,this,(FuncInfo *)funcInfo_00,false);
    if (bVar4) {
      ProcessCapturedSym(this,this_02);
      Symbol::EnsureScopeSlot(this_02,this,(FuncInfo *)funcInfo_00);
    }
  }
LAB_00808f87:
  PushScope(this,this_03);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitCatch(ParseNodeCatch *pnodeCatch)
{
    Assert(pnodeCatch->nop == knopCatch);

    Scope *scope = pnodeCatch->scope;
    FuncInfo *funcInfo = scope->GetFunc();

    // Catch scope is a dynamic object if it can be passed to a scoped lookup helper (i.e., eval is present or we're in an event handler).
    if (funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || (this->flags & (fscrEval | fscrImplicitThis)))
    {
        scope->SetIsObject();
    }

    if (pnodeCatch->HasPatternParam())
    {
        ParseNode *pnode1 = pnodeCatch->GetParam()->AsParseNodeParamPattern()->pnode1;
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval());
        scope->SetMustInstantiate(scope->Count() > 0 && (scope->GetMustInstantiate() || scope->GetCapturesAll() || funcInfo->IsGlobalFunction()));

        Parser::MapBindIdentifier(pnode1, [&](ParseNodePtr item)
        {
            Symbol *sym = item->AsParseNodeVar()->sym;
            if (funcInfo->IsGlobalFunction())
            {
                sym->SetIsGlobalCatch(true);
            }

            if (sym->NeedsScopeObject())
            {
                scope->SetIsObject();
            }

            Assert(sym->GetScopeSlot() == Js::Constants::NoProperty);
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                sym->EnsureScopeSlot(this, funcInfo);
            }
        });
    }
    else if (pnodeCatch->HasParam())
    {
        Symbol *sym = pnodeCatch->GetParam()->AsParseNodeName()->sym;

        // Catch object is stored in the catch scope if there may be an ambiguous lookup or a var declaration that hides it.
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || sym->GetHasNonLocalReference());
        scope->SetMustInstantiate(scope->GetCapturesAll() || funcInfo->IsGlobalFunction());

        if (funcInfo->IsGlobalFunction())
        {
            sym->SetIsGlobalCatch(true);
        }

        if (sym->NeedsScopeObject())
        {
            scope->SetIsObject();
        }

        if (scope->GetMustInstantiate())
        {
            if (sym->IsInSlot(this, funcInfo))
            {
                // Since there is only one symbol we are pushing to slot.
                // Also in order to make IsInSlot to return true - forcing the sym-has-non-local-reference.
                this->ProcessCapturedSym(sym);
                sym->EnsureScopeSlot(this, funcInfo);
            }
        }
    }

    PushScope(scope);
}